

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O3

void __thiscall
utObjImportExport_obj_import_test_Test::TestBody(utObjImportExport_obj_import_test_Test *this)

{
  aiMesh *this_00;
  bool bVar1;
  aiScene *expected;
  char *in_R9;
  char *message;
  ulong uVar2;
  AssertionResult gtest_ar_;
  SceneDiffer differ;
  AssertionResult gtest_ar;
  aiScene *scene;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertHelper local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  SceneDiffer local_68;
  string local_50;
  aiScene *local_30;
  
  message = "";
  local_30 = Assimp::Importer::ReadFileFromMemory
                       ((this->super_utObjImportExport).m_im,
                        "o 1\n\n# Vertex list\n\nv -0.5 -0.5  0.5\nv -0.5 -0.5 -0.5\nv -0.5  0.5 -0.5\nv -0.5  0.5  0.5\nv  0.5 -0.5  0.5\nv  0.5 -0.5 -0.5\nv  0.5  0.5 -0.5\nv  0.5  0.5  0.5\n\n# Point / Line / Face list\n\ng Box01\nusemtl Default\nf 4 3 2 1\nf 2 6 5 1\nf 3 7 6 2\nf 8 7 3 4\nf 5 8 4 1\nf 6 7 8 5\n\n# End of file\n"
                        ,0x11b,0,"");
  expected = utObjImportExport::createScene(&this->super_utObjImportExport);
  local_68.m_diffs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)&local_50,"nullptr","scene",(void **)&local_68,&local_30);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
      message = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0xec,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if (local_68.m_diffs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.m_diffs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        (**(code **)(((local_68.m_diffs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::SceneDiffer::SceneDiffer(&local_68);
  local_80.data_._0_1_ = (internal)Assimp::SceneDiffer::isEqual(&local_68,expected,local_30);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_80.data_._0_1_) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_50,(internal *)&local_80,
               (AssertionResult *)"differ.isEqual( expected, scene )","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0xef,(char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                      (char)local_50._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p));
    }
    if (local_88.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_88.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_88.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::SceneDiffer::showReport(&local_68);
  Assimp::Importer::FreeScene((this->super_utObjImportExport).m_im);
  if (expected->mNumMeshes != 0) {
    uVar2 = 0;
    do {
      this_00 = expected->mMeshes[uVar2];
      if (this_00 != (aiMesh *)0x0) {
        aiMesh::~aiMesh(this_00);
      }
      operator_delete(this_00);
      uVar2 = uVar2 + 1;
    } while (uVar2 < expected->mNumMeshes);
  }
  if (expected->mMeshes != (aiMesh **)0x0) {
    operator_delete__(expected->mMeshes);
  }
  expected->mMeshes = (aiMesh **)0x0;
  if (expected->mMaterials != (aiMaterial **)0x0) {
    operator_delete__(expected->mMaterials);
  }
  expected->mMaterials = (aiMaterial **)0x0;
  aiScene::~aiScene(expected);
  operator_delete(expected);
  Assimp::SceneDiffer::~SceneDiffer(&local_68);
  return;
}

Assistant:

TEST_F( utObjImportExport, obj_import_test ) {
    const aiScene *scene = m_im->ReadFileFromMemory( (void*) ObjModel, strlen(ObjModel), 0 );
    aiScene *expected = createScene();
    EXPECT_NE( nullptr, scene );

    SceneDiffer differ;
    EXPECT_TRUE( differ.isEqual( expected, scene ) );
    differ.showReport();

    m_im->FreeScene();
    for(unsigned int i = 0; i < expected->mNumMeshes; ++i)
    {
        delete expected->mMeshes[i];
    }
    delete[] expected->mMeshes;
    expected->mMeshes = nullptr;
    delete[] expected->mMaterials;
    expected->mMaterials = nullptr;
    delete expected;
}